

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O2

void __thiscall
absl::strings_internal::BigUnsigned<4>::MultiplyStep
          (BigUnsigned<4> *this,int original_size,uint32_t *other_words,int other_size,int step)

{
  uint64_t value;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (ulong)(original_size - 1U);
  if (step <= (int)(original_size - 1U)) {
    uVar1 = (ulong)(uint)step;
  }
  uVar4 = 0;
  value = 0;
  for (lVar2 = (long)(step - (int)uVar1); (-1 < (int)uVar1 && (lVar2 < other_size));
      lVar2 = lVar2 + 1) {
    uVar3 = (ulong)other_words[lVar2] * (ulong)this->words_[uVar1] + uVar4;
    uVar4 = uVar3 & 0xffffffff;
    value = value + (uVar3 >> 0x20);
    uVar1 = (ulong)((int)uVar1 - 1);
  }
  AddWithCarry(this,step + 1,value);
  this->words_[step] = (uint32_t)uVar4;
  if ((uVar4 != 0) && (this->size_ <= step)) {
    this->size_ = step + 1;
  }
  return;
}

Assistant:

void BigUnsigned<max_words>::MultiplyStep(int original_size,
                                          const uint32_t* other_words,
                                          int other_size, int step) {
  int this_i = std::min(original_size - 1, step);
  int other_i = step - this_i;

  uint64_t this_word = 0;
  uint64_t carry = 0;
  for (; this_i >= 0 && other_i < other_size; --this_i, ++other_i) {
    uint64_t product = words_[this_i];
    product *= other_words[other_i];
    this_word += product;
    carry += (this_word >> 32);
    this_word &= 0xffffffff;
  }
  AddWithCarry(step + 1, carry);
  words_[step] = this_word & 0xffffffff;
  if (this_word > 0 && size_ <= step) {
    size_ = step + 1;
  }
}